

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

BOOL __thiscall
Js::DynamicObject::GetObjectArrayItem
          (DynamicObject *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  ArrayObject *this_00;
  undefined1 local_31;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  DynamicObject *this_local;
  
  pRVar3 = ScriptContext::GetMissingItemResult(requestContext);
  *value = pRVar3;
  bVar1 = HasObjectArray(this);
  local_31 = false;
  if (bVar1) {
    this_00 = GetObjectArrayOrFlagsAsArray(this);
    BVar2 = RecyclableObject::GetItem
                      ((RecyclableObject *)this_00,originalInstance,index,value,requestContext);
    local_31 = BVar2 != 0;
  }
  return (BOOL)local_31;
}

Assistant:

BOOL DynamicObject::GetObjectArrayItem(Var originalInstance, uint32 index, Var* value, ScriptContext* requestContext)
    {
        *value = requestContext->GetMissingItemResult();
        return HasObjectArray() && GetObjectArrayOrFlagsAsArray()->GetItem(originalInstance, index, value, requestContext);
    }